

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_l1.c
# Opt level: O3

int picnic3_l1_write_public_key(picnic3_l1_publickey_t *key,uint8_t *buf,size_t buflen)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  
  iVar4 = -1;
  if (0x22 < buflen && (buf != (uint8_t *)0x0 && key != (picnic3_l1_publickey_t *)0x0)) {
    *buf = '\a';
    uVar1 = *(undefined8 *)(key->data + 8);
    uVar2 = *(undefined8 *)(key->data + 0x10);
    uVar3 = *(undefined8 *)(key->data + 0x18);
    *(undefined8 *)(buf + 1) = *(undefined8 *)key->data;
    *(undefined8 *)(buf + 9) = uVar1;
    *(undefined8 *)(buf + 0x11) = uVar2;
    *(undefined8 *)(buf + 0x19) = uVar3;
    *(undefined2 *)(buf + 0x21) = *(undefined2 *)(key->data + 0x20);
    iVar4 = 0x23;
  }
  return iVar4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic3_l1_write_public_key(const picnic3_l1_publickey_t* key,
                                                            uint8_t* buf, size_t buflen) {
  if (!key || !buf) {
    return -1;
  }

  if (buflen < PUBLIC_KEY_SIZE) {
    return -1;
  }

  buf[0] = PARAM;
  memcpy(buf + 1, key->data, PUBLIC_KEY_SIZE - 1);
  return PUBLIC_KEY_SIZE;
}